

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O0

void write_public(int state)

{
  int state_local;
  
  if ((((current_class != (Fl_Class_Type *)0x0) ||
       (current_widget_class != (Fl_Widget_Class_Type *)0x0)) &&
      ((current_class == (Fl_Class_Type *)0x0 || (current_class->write_public_state != state)))) &&
     ((current_widget_class == (Fl_Widget_Class_Type *)0x0 ||
      (current_widget_class->write_public_state != state)))) {
    if (current_class != (Fl_Class_Type *)0x0) {
      current_class->write_public_state = (char)state;
    }
    if (current_widget_class != (Fl_Widget_Class_Type *)0x0) {
      current_widget_class->write_public_state = (char)state;
    }
    if (state == 0) {
      write_h("private:\n");
    }
    else if (state == 1) {
      write_h("public:\n");
    }
    else if (state == 2) {
      write_h("protected:\n");
    }
  }
  return;
}

Assistant:

void write_public(int state) {
  if (!current_class && !current_widget_class) return;
  if (current_class && current_class->write_public_state == state) return;
  if (current_widget_class && current_widget_class->write_public_state == state) return;
  if (current_class) current_class->write_public_state = state;
  if (current_widget_class) current_widget_class->write_public_state = state;
  switch (state) {
    case 0: write_h("private:\n"); break;
    case 1: write_h("public:\n"); break;
    case 2: write_h("protected:\n"); break;
  }
}